

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O1

bool __thiscall
miniros::MasterLink::getNodes
          (MasterLink *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *nodes)

{
  pointer pcVar1;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar2;
  Error EVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  string *value;
  XmlRpcValue *pXVar7;
  int i;
  RpcValue payload;
  RpcValue args;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  node_set;
  RpcValue val;
  RpcValue result;
  string name;
  RpcValue local_d0;
  Error_t local_bc;
  XmlRpcValue local_b8;
  undefined1 local_a8 [8];
  undefined1 local_a0 [24];
  _Base_ptr local_88;
  size_t local_80;
  XmlRpcValue local_78;
  RpcValue local_68;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b8._type = TypeInvalid;
  local_b8._value.asDouble = 0.0;
  local_68._type = TypeInvalid;
  local_68._value.asDouble = 0.0;
  local_d0._type = TypeInvalid;
  local_d0._value.asDouble = 0.0;
  value = this_node::getName_abi_cxx11_();
  XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)local_a8,value);
  pXVar7 = XmlRpc::XmlRpcValue::operator[](&local_b8,0);
  XmlRpc::XmlRpcValue::operator=(pXVar7,(XmlRpcValue *)local_a8);
  XmlRpc::XmlRpcValue::invalidate((XmlRpcValue *)local_a8);
  local_a8 = (undefined1  [8])(local_a0 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"getSystemState","");
  EVar3 = execute(this,(string *)local_a8,&local_b8,&local_68,&local_d0,true);
  if (local_a8 != (undefined1  [8])(local_a0 + 8)) {
    operator_delete((void *)local_a8,local_a0._8_8_ + 1);
  }
  if (EVar3.code == Ok) {
    local_a0._16_8_ = local_a0;
    local_a0._0_4_ = 0;
    i = 0;
    local_a0._8_8_ = 0;
    local_80 = 0;
    local_bc = EVar3.code;
    local_88 = (_Base_ptr)local_a0._16_8_;
    local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)nodes;
    while( true ) {
      iVar4 = XmlRpc::XmlRpcValue::size(&local_d0);
      pvVar2 = local_58;
      if (iVar4 <= i) break;
      iVar4 = 0;
      while( true ) {
        pXVar7 = XmlRpc::XmlRpcValue::operator[](&local_d0,i);
        iVar5 = XmlRpc::XmlRpcValue::size(pXVar7);
        if (iVar5 <= iVar4) break;
        pXVar7 = XmlRpc::XmlRpcValue::operator[](&local_d0,i);
        pXVar7 = XmlRpc::XmlRpcValue::operator[](pXVar7,iVar4);
        pXVar7 = XmlRpc::XmlRpcValue::operator[](pXVar7,1);
        local_78._type = TypeInvalid;
        XmlRpc::XmlRpcValue::operator=(&local_78,pXVar7);
        iVar5 = 0;
        while( true ) {
          iVar6 = XmlRpc::XmlRpcValue::size(&local_78);
          if (iVar6 <= iVar5) break;
          pXVar7 = XmlRpc::XmlRpcValue::operator[](&local_d0,i);
          pXVar7 = XmlRpc::XmlRpcValue::operator[](pXVar7,iVar4);
          pXVar7 = XmlRpc::XmlRpcValue::operator[](pXVar7,1);
          pXVar7 = XmlRpc::XmlRpcValue::operator[](pXVar7,iVar5);
          XmlRpc::XmlRpcValue::assertTypeOrInvalid(pXVar7,TypeString);
          pcVar1 = (((pXVar7->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar1,
                     (((pXVar7->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>).
                     _M_impl.super__Vector_impl_data._M_finish + (long)pcVar1);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_a8,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          iVar5 = iVar5 + 1;
        }
        XmlRpc::XmlRpcValue::invalidate(&local_78);
        iVar4 = iVar4 + 1;
      }
      i = i + 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_58,*(pointer *)local_58);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              (pvVar2,*(undefined8 *)(pvVar2 + 8),local_a0._16_8_,local_a0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8);
    EVar3.code = local_bc;
  }
  XmlRpc::XmlRpcValue::invalidate(&local_d0);
  XmlRpc::XmlRpcValue::invalidate(&local_68);
  XmlRpc::XmlRpcValue::invalidate(&local_b8);
  return EVar3.code == Ok;
}

Assistant:

bool MasterLink::getNodes(std::vector<std::string>& nodes) const
{
  RpcValue args, result, payload;
  args[0] = this_node::getName();

  if (!execute("getSystemState", args, result, payload, true)) {
    return false;
  }

  std::set<std::string> node_set;
  for (int i = 0; i < payload.size(); ++i) {
    for (int j = 0; j < payload[i].size(); ++j) {
      RpcValue val = payload[i][j][1];
      for (int k = 0; k < val.size(); ++k) {
        std::string name = payload[i][j][1][k];
        node_set.insert(name);
      }
    }
  }

  nodes.clear();
  nodes.insert(nodes.end(), node_set.begin(), node_set.end());

  return true;
}